

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderInvarianceRule4Test::initTestIterations
          (TessellationShaderInvarianceRule4Test *this)

{
  GLfloat primitive_mode_00;
  bool bVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  int local_d0;
  undefined1 auStack_cc [4];
  int n;
  _test_iteration test;
  _tessellation_levels *current_levels;
  __normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_98;
  __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_90;
  _tessellation_levels_set_const_iterator levels_iterator;
  _tessellation_levels_set local_78;
  undefined1 local_60 [8];
  _tessellation_levels_set levels;
  _tessellation_shader_vertex_spacing vs_mode;
  uint n_vs_mode;
  _tessellation_primitive_mode primitive_mode;
  uint n_primitive_mode;
  uint n_vs_modes;
  uint n_primitive_modes;
  _tessellation_shader_vertex_spacing vs_modes [3];
  _tessellation_primitive_mode primitive_modes [2];
  GLint gl_max_tess_gen_level_value;
  Functions *gl;
  TessellationShaderInvarianceRule4Test *this_local;
  
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.
                      m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar2);
  primitive_modes[0] = TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST;
  (**(code **)(register0x00000000 + 0x868))
            ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.m_glExtTokens.
             MAX_TESS_GEN_LEVEL,primitive_modes);
  err = (**(code **)(stack0xffffffffffffffe8 + 0x800))();
  glu::checkError(err,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x68f);
  vs_modes[1] = TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD;
  vs_modes[2] = TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN;
  _n_vs_modes = 0x100000000;
  vs_modes[0] = TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD;
  for (n_vs_mode = 0; n_vs_mode < 2; n_vs_mode = n_vs_mode + 1) {
    primitive_mode_00 = (GLfloat)vs_modes[(ulong)n_vs_mode + 1];
    for (levels.
         super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        levels.
        super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 3;
        levels.
        super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             levels.
             super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      levels.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (GLfloat)(&n_vs_modes)
                    [levels.
                     super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_];
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::vector
                ((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                  *)local_60);
      TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
                (&local_78,(_tessellation_primitive_mode)primitive_mode_00,primitive_modes[0],
                 TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      operator=((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *
                )local_60,&local_78);
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      ~vector(&local_78);
      local_98._M_current =
           (_tessellation_levels *)
           std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
           begin((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                  *)local_60);
      __gnu_cxx::
      __normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
      ::__normal_iterator<glcts::_tessellation_levels*>
                ((__normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
                  *)&local_90,&local_98);
      while( true ) {
        current_levels =
             (_tessellation_levels *)
             std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
             ::end((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                    *)local_60);
        bVar1 = __gnu_cxx::operator!=
                          (&local_90,
                           (__normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
                            *)&current_levels);
        if (!bVar1) break;
        test._28_8_ = __gnu_cxx::
                      __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
                      ::operator*(&local_90);
        _test_iteration::_test_iteration((_test_iteration *)auStack_cc);
        _auStack_cc = *(GLfloat (*) [2])test._28_8_;
        for (local_d0 = 0; local_d0 < 4; local_d0 = local_d0 + 1) {
          test.inner_tess_levels[local_d0] = *(GLfloat *)(test._28_8_ + 8);
        }
        test.outer_tess_levels[3] =
             levels.
             super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
        test.outer_tess_levels[2] = primitive_mode_00;
        std::
        vector<glcts::TessellationShaderInvarianceRule4Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule4Test::_test_iteration>_>
        ::push_back(&this->m_test_iterations,(value_type *)auStack_cc);
        __gnu_cxx::
        __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
        ::operator++(&local_90,0);
      }
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      ~vector((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
              local_60);
    }
  }
  return;
}

Assistant:

void TessellationShaderInvarianceRule4Test::initTestIterations()
{
	DE_ASSERT(m_test_iterations.size() == 0);

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	const glw::Functions& gl						  = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Iterate through all primitive and vertex spacing modes relevant to the test */
	_tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
													   TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	_tessellation_shader_vertex_spacing vs_modes[] = { TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
													   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
													   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD };

	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);
	const unsigned int n_vs_modes		 = sizeof(vs_modes) / sizeof(vs_modes[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		for (unsigned int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
		{
			_tessellation_shader_vertex_spacing vs_mode = vs_modes[n_vs_mode];

			/* Retrieve inner/outer tessellation level combinations we want the tests to be run for */
			_tessellation_levels_set levels;

			levels = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
				primitive_mode, gl_max_tess_gen_level_value,
				TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

			/* Iterate through all configurations */
			for (_tessellation_levels_set_const_iterator levels_iterator = levels.begin();
				 levels_iterator != levels.end(); levels_iterator++)
			{
				const _tessellation_levels& current_levels = *levels_iterator;

				/* Create a test descriptor for all the parameters we now have.
				 *
				 * The set we're operating on uses different outer tessellation level values, so we
				 * need to make sure the levels are set to the same FP values in order for the test
				 * to succeed. */
				_test_iteration test;

				memcpy(test.inner_tess_levels, current_levels.inner, sizeof(test.inner_tess_levels));

				for (int n = 0; n < 4 /* outer tess levels */; ++n)
				{
					test.outer_tess_levels[n] = current_levels.outer[0];
				}

				test.primitive_mode = primitive_mode;
				test.vertex_spacing = vs_mode;

				m_test_iterations.push_back(test);
			} /* for (all inner/outer tessellation levels) */
		}	 /* for (all vertex spacing modes) */
	}		  /* for (all primitive modes) */
}